

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

void __thiscall
Fad<double>::
Fad<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,Fad<double>>>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,Fad<double>>>,FadExpr<FadBinaryMul<FadCst<int>,Fad<double>>>>>>>>>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,Fad<double>>>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,Fad<double>>>,FadExpr<FadBinaryMul<FadCst<int>,Fad<double>>>>>>>>>>>
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  ulong uVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  
  vVar5 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::val(&((fadexpr->fadexpr_).left_)->fadexpr_);
  vVar6 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::val(&((fadexpr->fadexpr_).right_)->fadexpr_);
  this->val_ = vVar6 * vVar5;
  uVar1 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::size(&((fadexpr->fadexpr_).left_)->fadexpr_);
  uVar2 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::size(&((fadexpr->fadexpr_).right_)->fadexpr_);
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  (this->dx_).num_elts = 0;
  (this->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar2) {
    (this->dx_).num_elts = uVar2;
    pdVar3 = (double *)operator_new__((ulong)uVar2 << 3);
    (this->dx_).ptr_to_data = pdVar3;
  }
  this->defaultVal = 0.0;
  uVar1 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::size(&((fadexpr->fadexpr_).left_)->fadexpr_);
  uVar2 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::size(&((fadexpr->fadexpr_).right_)->fadexpr_);
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      vVar7 = FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
              ::dx(&fadexpr->fadexpr_,(int)uVar4);
      (this->dx_).ptr_to_data[uVar4] = vVar7;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }